

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  reference pdVar2;
  ostream *poVar3;
  int t;
  int iVar4;
  int i;
  size_type i_00;
  int tmp;
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> input;
  ESOINN model;
  ifstream ifs;
  
  soinn::ESOINN::ESOINN(&model,4,4,0x1e,0.001,1.0);
  std::ifstream::ifstream(&ifs);
  std::ifstream::open((char *)&ifs,0x141d80);
  std::ifstream::open((char *)&ifs,0x141d8a);
  boost::numeric::ublas::
  vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::vector
            (&input,4);
  for (iVar4 = 0; iVar4 != 0x96; iVar4 = iVar4 + 1) {
    for (i_00 = 0; i_00 != 4; i_00 = i_00 + 1) {
      std::istream::operator>>((istream *)&ifs,&tmp);
      iVar1 = tmp;
      pdVar2 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::operator[]
                         (&input.data_,i_00);
      *pdVar2 = (double)iVar1;
    }
    soinn::ESOINN::process
              (&model,(vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)&input.data_);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  soinn::ESOINN::classify(&model);
  poVar3 = std::operator<<((ostream *)&std::cout,"number of classes: ");
  iVar4 = soinn::ESOINN::getNumberOfClasses(&model);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"number of vertices: ");
  iVar4 = soinn::ESOINN::getNumberOfVertices(&model);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&input.data_);
  std::ifstream::~ifstream(&ifs);
  soinn::ESOINN::~ESOINN(&model);
  return 0;
}

Assistant:

int main() {
    soinn::ESOINN model(4, 4, 30);
    std::ifstream ifs;
    ifs.open("input.txt");
    ifs.open("iris.txt");
    boost::numeric::ublas::vector<double> input(4);
    int num;
    int tmp;
    for(int t = 0; t < 150; t++) {
        for(int i = 0; i < 4; i++) {
            ifs>>tmp;
            input(i) = double(tmp);
        }
        model.process(input);
        std::cout<<t<<std::endl;
    }
    model.classify();
    std::cout<<"number of classes: "<<model.getNumberOfClasses()<<std::endl;
    std::cout<<"number of vertices: "<<model.getNumberOfVertices()<<std::endl;
}